

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_client_open(archive_write_filter *f)

{
  archive *a_00;
  archive *a_01;
  int iVar1;
  int iVar2;
  size_t *__ptr;
  void *__ptr_00;
  int iVar3;
  archive_write *a;
  archive_write *a_1;
  size_t __size;
  
  a_00 = f->archive;
  iVar1 = __archive_check_magic(a_00,0xb0c5c0de,0x7fff,"archive_write_get_bytes_per_block");
  iVar3 = -0x1e;
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    iVar2 = (int)a_00[1].error_string.length;
  }
  f->bytes_per_block = iVar2;
  a_01 = f->archive;
  iVar2 = __archive_check_magic(a_01,0xb0c5c0de,0x7fff,"archive_write_get_bytes_in_last_block");
  if (iVar2 != -0x1e) {
    iVar3 = *(int *)((long)&a_01[1].error_string.length + 4);
  }
  f->bytes_in_last_block = iVar3;
  __size = (size_t)f->bytes_per_block;
  __ptr = (size_t *)calloc(1,0x20);
  __ptr_00 = malloc(__size);
  if (__ptr == (size_t *)0x0 || __ptr_00 == (void *)0x0) {
    free(__ptr);
    free(__ptr_00);
    archive_set_error(f->archive,0xc,"Can\'t allocate data for output buffering");
    iVar2 = -0x1e;
  }
  else {
    *__ptr = __size;
    __ptr[2] = (size_t)__ptr_00;
    __ptr[3] = (size_t)__ptr_00;
    __ptr[1] = __size;
    f->data = __ptr;
    if ((code *)a_00[1].compression_name != (code *)0x0) {
      iVar2 = (*(code *)a_00[1].compression_name)(f->archive,a_00[1].error_string.s);
      return iVar2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
archive_write_client_open(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state;
	void *buffer;
	size_t buffer_size;

	f->bytes_per_block = archive_write_get_bytes_per_block(f->archive);
	f->bytes_in_last_block =
	    archive_write_get_bytes_in_last_block(f->archive);
	buffer_size = f->bytes_per_block;

	state = (struct archive_none *)calloc(1, sizeof(*state));
	buffer = (char *)malloc(buffer_size);
	if (state == NULL || buffer == NULL) {
		free(state);
		free(buffer);
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for output buffering");
		return (ARCHIVE_FATAL);
	}

	state->buffer_size = buffer_size;
	state->buffer = buffer;
	state->next = state->buffer;
	state->avail = state->buffer_size;
	f->data = state;

	if (a->client_opener == NULL)
		return (ARCHIVE_OK);
	return (a->client_opener(f->archive, a->client_data));
}